

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O0

void __thiscall flexbuffers::Builder::Finish(Builder *this)

{
  uint8_t byte_width_00;
  uint8_t val;
  BitWidth alignment;
  size_type_conflict sVar1;
  reference pvVar2;
  uint8_t byte_width;
  Builder *this_local;
  
  sVar1 = std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>::
          size(&this->stack_);
  if (sVar1 == 1) {
    pvVar2 = std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ::operator[](&this->stack_,0);
    sVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buf_);
    alignment = Value::ElemWidth(pvVar2,sVar1,0);
    byte_width_00 = Align(this,alignment);
    pvVar2 = std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ::operator[](&this->stack_,0);
    WriteAny(this,pvVar2,byte_width_00);
    pvVar2 = std::vector<flexbuffers::Builder::Value,_std::allocator<flexbuffers::Builder::Value>_>
             ::operator[](&this->stack_,0);
    val = Value::StoredPackedType(pvVar2,BIT_WIDTH_8);
    Write<unsigned_char>(this,val,1);
    Write<unsigned_char>(this,byte_width_00,1);
    this->finished_ = true;
    return;
  }
  __assert_fail("stack_.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                ,0x580,"void flexbuffers::Builder::Finish()");
}

Assistant:

void Finish() {
    // If you hit this assert, you likely have objects that were never included
    // in a parent. You need to have exactly one root to finish a buffer.
    // Check your Start/End calls are matched, and all objects are inside
    // some other object.
    FLATBUFFERS_ASSERT(stack_.size() == 1);

    // Write root value.
    auto byte_width = Align(stack_[0].ElemWidth(buf_.size(), 0));
    WriteAny(stack_[0], byte_width);
    // Write root type.
    Write(stack_[0].StoredPackedType(), 1);
    // Write root size. Normally determined by parent, but root has no parent :)
    Write(byte_width, 1);

    finished_ = true;
  }